

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O0

void AddContent(QuadTreeNode *Tree,Container *NewContent,int divider)

{
  double dVar1;
  undefined8 *puVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  int in_EDX;
  QuadTreeNode *in_RSI;
  BoundingBox *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Container *Next;
  Container *CPtr;
  int c;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 *__ptr;
  
  iVar3 = Separated((BoundingBox *)(in_RSI->Bounder).BR.Pos[0],in_RDI);
  if (iVar3 == 0) {
    if (in_RDI[1].BR.Pos[1] == 0.0) {
      *(int *)in_RDI[1].TL.Pos = *(int *)in_RDI[1].TL.Pos + 1;
      dVar1 = in_RDI[1].TL.Pos[1];
      pvVar4 = malloc(0x18);
      in_RDI[1].TL.Pos[1] = (double)pvVar4;
      *(double *)((long)in_RDI[1].TL.Pos[1] + 0x10) = (in_RSI->Bounder).BR.Pos[0];
      *(undefined4 *)((long)in_RDI[1].TL.Pos[1] + 8) = *(undefined4 *)((in_RSI->Bounder).TL.Pos + 1)
      ;
      *(double *)in_RDI[1].TL.Pos[1] = dVar1;
      if (((*(int *)in_RDI[1].TL.Pos == in_EDX) &&
          ((double)screen_width < (in_RDI->BR).Pos[0] - (in_RDI->TL).Pos[0])) &&
         ((double)screen_height < (in_RDI->BR).Pos[1] - (in_RDI->TL).Pos[1])) {
        pvVar4 = malloc(0x120);
        in_RDI[1].BR.Pos[1] = (double)pvVar4;
        iVar3 = 4;
        while (iVar5 = iVar3 + -1, iVar3 != 0) {
          dVar1 = in_RDI[1].BR.Pos[1];
          lVar6 = (long)iVar5;
          dVar7 = GetX1(iVar5,in_RDI);
          dVar8 = GetY1(iVar5,in_RDI);
          dVar9 = GetX2(iVar5,in_RDI);
          dVar10 = GetY2(iVar5,in_RDI);
          SetupQuadTree((QuadTreeNode *)((long)dVar1 + lVar6 * 0x48),(int)dVar7,(int)dVar8,
                        (int)dVar9,(int)dVar10);
          iVar3 = iVar5;
        }
        __ptr = (undefined8 *)in_RDI[1].TL.Pos[1];
        while (__ptr != (undefined8 *)0x0) {
          puVar2 = (undefined8 *)*__ptr;
          iVar3 = 4;
          while (iVar5 = iVar3 + -1, iVar3 != 0) {
            AddContent(in_RSI,(Container *)CONCAT44(in_EDX,iVar5),(int)((ulong)__ptr >> 0x20));
            iVar3 = iVar5;
          }
          free(__ptr);
          __ptr = puVar2;
        }
        in_RDI[1].TL.Pos[1] = 0.0;
      }
    }
    else {
      iVar3 = 4;
      while (iVar5 = iVar3 + -1, iVar3 != 0) {
        AddContent(in_RSI,(Container *)CONCAT44(in_EDX,iVar5),
                   (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
        iVar3 = iVar5;
      }
    }
  }
  return;
}

Assistant:

static void AddContent(struct QuadTreeNode *Tree, struct Container *NewContent,
                int divider)
{
   int c;
   struct Container *CPtr, *Next;

   /*

      First check: does the refered new content actually overlap with this
      node? If not, do nothing

      NB: this code explicitly checks the bounding box of an 'edge' held in
      NewContent, even though it may hold an edge, triangle or object. This is
      fine because we've set up our structs so that the bounding box
      information is at the same location regardless

    */
   if (Separated(&NewContent->Content.E->Bounder, &Tree->Bounder))
      return;

   /*

      Second check: has this node been subdivided? If so, pass on for
      children to deal with

    */
   if (Tree->Children) {
      c = 4;
      while (c--)
         AddContent(&Tree->Children[c], NewContent, divider);
   } else {
      /*

         If we're here, then the edge really does need to be added to the
         current node, so do that

       */
      Tree->NumContents++;
      CPtr = Tree->Contents;
      Tree->Contents = (struct Container *)malloc(sizeof(struct Container));
      Tree->Contents->Content = NewContent->Content;
      Tree->Contents->Type = NewContent->Type;
      Tree->Contents->Next = CPtr;

      /*

         Now check if we've hit the maximum content count for this node. If
         so, subdivide

       */
      if ((Tree->NumContents == divider)
          && ((Tree->Bounder.BR.Pos[0] - Tree->Bounder.TL.Pos[0]) > screen_width)
          && ((Tree->Bounder.BR.Pos[1] - Tree->Bounder.TL.Pos[1]) > screen_height)) {
         /* allocate new memory and set up structures */
         Tree->Children =
            (struct QuadTreeNode *)malloc(sizeof(struct QuadTreeNode)
                                          * 4);
         c = 4;
         while (c--)
            SetupQuadTree(&Tree->Children[c],
                          GetX1(c, &Tree->Bounder), GetY1(c,
                                                          &Tree->
                                                          Bounder),
                          GetX2(c, &Tree->Bounder), GetY2(c, &Tree->Bounder));

         /* redistribute contents currently stored here */
         CPtr = Tree->Contents;
         while (CPtr) {
            Next = CPtr->Next;

            c = 4;
            while (c--)
               AddContent(&Tree->Children[c], CPtr, divider);

            free(CPtr);
            CPtr = Next;
         }
         Tree->Contents = NULL;
      }
   }
}